

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::DoBackgroundParallelMark(Recycler *this)

{
  ObservableValue<Memory::CollectionState> *pOVar1;
  MarkContext *markContext;
  MarkContext *markContext_00;
  undefined4 *puVar2;
  ObservableValueObserver<Memory::CollectionState> *pOVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  undefined8 *in_FS_OFFSET;
  MarkContext *local_68;
  MarkContext *splitContexts [2];
  CollectionState local_34;
  
  markContext = &this->parallelMarkContext2;
  markContext_00 = &this->parallelMarkContext3;
  uVar7 = 0;
  local_68 = markContext;
  splitContexts[0] = markContext_00;
  if (this->enableParallelMark == true) {
    if (2 < this->maxParallelism - 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xa3d,"(this->maxParallelism > 1 && this->maxParallelism <= 4)",
                         "this->maxParallelism > 1 && this->maxParallelism <= 4");
      if (!bVar5) goto LAB_0026cb25;
      *puVar2 = 0;
    }
    uVar7 = 0;
    if (2 < this->maxParallelism) {
      uVar7 = MarkContext::Split(&this->markContext,this->maxParallelism - 2,&local_68);
    }
  }
  if (2 < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa44,"(actualSplitCount <= 2)","actualSplitCount <= 2");
    if (!bVar5) goto LAB_0026cb25;
    *puVar2 = 0;
  }
  if (uVar7 == 0) {
    ProcessMark(this,false);
  }
  else {
    bVar5 = DoQueueTrackedObject(this);
    if ((!bVar5) && (this->inPartialCollectMode == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xa4f,"(this->DoQueueTrackedObject() || this->inPartialCollectMode)",
                         "this->DoQueueTrackedObject() || this->inPartialCollectMode");
      if (!bVar5) {
LAB_0026cb25:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar2 = 0;
    }
    pOVar1 = &this->collectionState;
    local_34 = CollectionStateBackgroundParallelMark;
    pOVar3 = (this->collectionState).observer;
    if ((pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
       ((this->collectionState).value != CollectionStateBackgroundParallelMark)) {
      (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,&local_34,pOVar1);
    }
    (this->collectionState).value = local_34;
    bVar5 = RecyclerParallelThread::StartConcurrent(&this->parallelThread1);
    if (uVar7 == 2 && bVar5) {
      bVar6 = RecyclerParallelThread::StartConcurrent(&this->parallelThread2);
    }
    else {
      bVar6 = false;
    }
    if (this->enableScanInteriorPointers == true) {
      ProcessMarkContext<true,true>(this,&this->markContext);
    }
    else {
      ProcessMarkContext<true,false>(this,&this->markContext);
    }
    if (bVar5) {
      RecyclerParallelThread::WaitForConcurrent(&this->parallelThread1);
    }
    else if (this->enableScanInteriorPointers == true) {
      ProcessMarkContext<true,true>(this,markContext);
    }
    else {
      ProcessMarkContext<true,false>(this,markContext);
    }
    if (uVar7 == 2) {
      if (bVar6 == false) {
        if (this->enableScanInteriorPointers == true) {
          ProcessMarkContext<true,true>(this,markContext_00);
        }
        else {
          ProcessMarkContext<true,false>(this,markContext_00);
        }
      }
      else {
        RecyclerParallelThread::WaitForConcurrent(&this->parallelThread2);
      }
    }
    local_34 = CollectionStateConcurrentMark;
    pOVar3 = (this->collectionState).observer;
    if ((pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
       ((this->collectionState).value != CollectionStateConcurrentMark)) {
      (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,&local_34,pOVar1);
    }
    pOVar1->value = local_34;
  }
  return;
}

Assistant:

void
Recycler::DoBackgroundParallelMark()
{
    // Split the mark stack into [this->maxParallelism - 1] equal pieces (thus, "- 2" below).
    // The actual # of splits is returned, in case the stack was too small to split that many ways.
    // The parallel threads are hardwired to use parallelMarkContext2/3, so we split using those.
    uint actualSplitCount = 0;
    MarkContext * splitContexts[2] = { &parallelMarkContext2, &parallelMarkContext3 };
    if (this->enableParallelMark)
    {
        Assert(this->maxParallelism > 1 && this->maxParallelism <= 4);
        if (this->maxParallelism > 2)
        {
            actualSplitCount = markContext.Split(this->maxParallelism - 2, splitContexts);
        }
    }

    Assert(actualSplitCount <= 2);

    // If we failed to split at all, just mark in thread with no parallelism.
    if (actualSplitCount == 0)
    {
        this->ProcessMark(true);
        return;
    }

#if ENABLE_PARTIAL_GC
    // We should already be set up to queue tracked objects, unless this is a partial collect
    Assert(this->DoQueueTrackedObject() || this->inPartialCollectMode);
#else
    Assert(this->DoQueueTrackedObject());
#endif

    this->SetCollectionState(CollectionStateBackgroundParallelMark);

    // Kick off marking on parallel threads too, if there is work for them
    // If the threads haven't been created yet, this will create them (or fail).
    bool parallelSuccess1 = false;
    bool parallelSuccess2 = false;
    parallelSuccess1 = parallelThread1.StartConcurrent();
    if (parallelSuccess1 && actualSplitCount == 2)
    {
        parallelSuccess2 = parallelThread2.StartConcurrent();
    }

    // Process our portion of the split.
    this->ProcessParallelMark(true, &markContext);

    // If we successfully launched parallel work, wait for it to complete.
    // If we failed, then process the work in-thread now.
    if (parallelSuccess1)
    {
        parallelThread1.WaitForConcurrent();
    }
    else
    {
        this->ProcessParallelMark(true, &parallelMarkContext2);
    }

    if (actualSplitCount == 2)
    {
        if (parallelSuccess2)
        {
            parallelThread2.WaitForConcurrent();
        }
        else
        {
            this->ProcessParallelMark(true, &parallelMarkContext3);
        }
    }

    this->SetCollectionState(CollectionStateConcurrentMark);
}